

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

CURLcode Curl_mime_prepare_headers
                   (Curl_easy *data,curl_mimepart *part,char *contenttype,char *disposition,
                   mimestrategy strategy)

{
  curl_slist **slp;
  bool bVar1;
  int iVar2;
  CURLcode CVar3;
  CURLcode CVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  curl_slist *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  void *pvVar15;
  curl_mimepart *part_00;
  
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = (curl_slist *)0x0;
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    (part->state).state = MIMESTATE_CURLHEADERS;
    (part->state).ptr = (void *)0x0;
    (part->state).offset = 0;
  }
  pcVar10 = part->mimetype;
  if (pcVar10 == (char *)0x0) {
    pcVar9 = part->userheaders;
    if (pcVar9 == (curl_slist *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      do {
        pcVar10 = match_header(pcVar9,"Content-Type",0xc);
        if (pcVar10 != (char *)0x0) break;
        pcVar9 = pcVar9->next;
      } while (pcVar9 != (curl_slist *)0x0);
    }
  }
  if (pcVar10 != (char *)0x0) {
    contenttype = pcVar10;
  }
  if (contenttype == (char *)0x0) {
    if (part->kind == MIMEKIND_MULTIPART) {
      contenttype = "multipart/mixed";
    }
    else if (part->kind == MIMEKIND_FILE) {
      contenttype = Curl_mime_contenttype(part->filename);
      if (contenttype == (char *)0x0) {
        contenttype = Curl_mime_contenttype(part->data);
      }
      if ((contenttype == (char *)0x0) &&
         (contenttype = "application/octet-stream", part->filename == (char *)0x0)) {
        contenttype = (char *)0x0;
      }
    }
    else {
      contenttype = Curl_mime_contenttype(part->filename);
    }
  }
  if (part->kind == MIMEKIND_MULTIPART) {
    pvVar15 = part->arg;
    pcVar10 = (char *)((long)pvVar15 + 0x18);
    if (pvVar15 == (void *)0x0) {
      pcVar10 = (char *)0x0;
    }
  }
  else {
    if ((((pcVar10 == (char *)0x0) && (contenttype != (char *)0x0)) &&
        (iVar2 = curl_strnequal(contenttype,"text/plain",10), iVar2 != 0)) &&
       ((((ulong)(byte)contenttype[10] < 0x3c &&
         ((0x800000100002601U >> ((ulong)(byte)contenttype[10] & 0x3f) & 1) != 0)) &&
        ((strategy == MIMESTRATEGY_MAIL || (part->filename == (char *)0x0)))))) {
      contenttype = (char *)0x0;
    }
    pvVar15 = (void *)0x0;
    pcVar10 = (char *)0x0;
  }
  slp = &part->curlheaders;
  pcVar9 = part->userheaders;
  if (pcVar9 == (curl_slist *)0x0) {
LAB_0010efb2:
    if (disposition == (char *)0x0) {
      if (((part->filename == (char *)0x0) && (part->name == (char *)0x0)) &&
         ((contenttype == (char *)0x0 ||
          (iVar2 = curl_strnequal(contenttype,"multipart/",10), iVar2 != 0)))) {
        disposition = (char *)0x0;
      }
      else {
        disposition = "attachment";
      }
    }
    CVar3 = CURLE_OK;
    if (disposition == (char *)0x0) {
      disposition = (char *)0x0;
    }
    else {
      iVar2 = curl_strequal(disposition,"attachment");
      if (((iVar2 != 0) && (part->name == (char *)0x0)) && (part->filename == (char *)0x0)) {
        disposition = (char *)0x0;
      }
    }
    if (disposition != (char *)0x0) {
      CVar3 = CURLE_OK;
      bVar1 = true;
      if (part->name == (char *)0x0) {
LAB_0010f0e5:
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = escape_string(data,part->name,strategy);
        if (pcVar5 == (char *)0x0) {
          CVar3 = CURLE_OUT_OF_MEMORY;
          bVar1 = false;
          goto LAB_0010f0e5;
        }
      }
      pcVar6 = (char *)0x0;
      if (bVar1) {
        if (part->filename == (char *)0x0) {
          CVar3 = CURLE_OK;
        }
        else {
          pcVar6 = escape_string(data,part->filename,strategy);
          CVar3 = CURLE_OUT_OF_MEMORY;
          if (pcVar6 != (char *)0x0) {
            CVar3 = CURLE_OK;
          }
        }
      }
      if (CVar3 == CURLE_OK) {
        pcVar7 = "; name=\"";
        pcVar11 = pcVar5;
        if (pcVar5 == (char *)0x0) {
          pcVar7 = "";
          pcVar11 = "";
        }
        pcVar13 = "\"";
        pcVar12 = "\"";
        if (pcVar5 == (char *)0x0) {
          pcVar12 = "";
        }
        pcVar14 = "; filename=\"";
        pcVar8 = pcVar6;
        if (pcVar6 == (char *)0x0) {
          pcVar14 = "";
          pcVar8 = "";
          pcVar13 = "";
        }
        CVar3 = Curl_mime_add_header
                          (slp,"Content-Disposition: %s%s%s%s%s%s%s",disposition,pcVar7,pcVar11,
                           pcVar12,pcVar14,pcVar8,pcVar13);
      }
      (*Curl_cfree)(pcVar5);
      (*Curl_cfree)(pcVar6);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
    }
  }
  else {
    do {
      pcVar5 = match_header(pcVar9,"Content-Disposition",0x13);
      if (pcVar5 != (char *)0x0) break;
      pcVar9 = pcVar9->next;
    } while (pcVar9 != (curl_slist *)0x0);
    CVar3 = CURLE_OK;
    if (pcVar5 == (char *)0x0) goto LAB_0010efb2;
  }
  if (contenttype != (char *)0x0) {
    pcVar5 = "; boundary=";
    if (pcVar10 == (char *)0x0) {
      pcVar5 = "";
      pcVar10 = "";
    }
    CVar3 = CURLE_OK;
    CVar4 = Curl_mime_add_header(slp,"Content-Type: %s%s%s",contenttype,pcVar5,pcVar10);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
  }
  pcVar9 = part->userheaders;
  if (pcVar9 != (curl_slist *)0x0) {
    do {
      pcVar10 = match_header(pcVar9,"Content-Transfer-Encoding",0x19);
      if (pcVar10 != (char *)0x0) break;
      pcVar9 = pcVar9->next;
    } while (pcVar9 != (curl_slist *)0x0);
    if (pcVar10 != (char *)0x0) goto LAB_0010f2b8;
  }
  if (part->encoder == (mime_encoder *)0x0) {
    pcVar10 = (char *)0x0;
    if (((strategy == MIMESTRATEGY_MAIL) && (contenttype != (char *)0x0)) &&
       (pcVar10 = (char *)0x0, part->kind != MIMEKIND_MULTIPART)) {
      pcVar10 = "8bit";
    }
  }
  else {
    pcVar10 = part->encoder->name;
  }
  if (pcVar10 != (char *)0x0) {
    CVar3 = CURLE_OK;
    CVar4 = Curl_mime_add_header(slp,"Content-Transfer-Encoding: %s");
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
  }
LAB_0010f2b8:
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    pcVar9 = part->curlheaders;
    (part->state).state = MIMESTATE_CURLHEADERS;
    (part->state).ptr = pcVar9;
    (part->state).offset = 0;
  }
  if ((pvVar15 != (void *)0x0) && (part->kind == MIMEKIND_MULTIPART)) {
    if ((contenttype == (char *)0x0) ||
       (((iVar2 = curl_strnequal(contenttype,"multipart/form-data",0x13), iVar2 == 0 ||
         (0x3b < (ulong)(byte)contenttype[0x13])) ||
        ((0x800000100002601U >> ((ulong)(byte)contenttype[0x13] & 0x3f) & 1) == 0)))) {
      pcVar10 = (char *)0x0;
    }
    else {
      pcVar10 = "form-data";
    }
    part_00 = *(curl_mimepart **)((long)pvVar15 + 8);
    if (part_00 != (curl_mimepart *)0x0) {
      do {
        CVar3 = Curl_mime_prepare_headers(data,part_00,(char *)0x0,pcVar10,strategy);
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
        part_00 = part_00->nextpart;
      } while (part_00 != (curl_mimepart *)0x0);
      CVar3 = CURLE_OK;
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_mime_prepare_headers(struct Curl_easy *data,
                                   curl_mimepart *part,
                                   const char *contenttype,
                                   const char *disposition,
                                   enum mimestrategy strategy)
{
  curl_mime *mime = NULL;
  const char *boundary = NULL;
  char *customct;
  const char *cte = NULL;
  CURLcode ret = CURLE_OK;

  /* Get rid of previously prepared headers. */
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = NULL;

  /* Be sure we won't access old headers later. */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, NULL);

  /* Check if content type is specified. */
  customct = part->mimetype;
  if(!customct)
    customct = search_header(part->userheaders, STRCONST("Content-Type"));
  if(customct)
    contenttype = customct;

  /* If content type is not specified, try to determine it. */
  if(!contenttype) {
    switch(part->kind) {
    case MIMEKIND_MULTIPART:
      contenttype = MULTIPART_CONTENTTYPE_DEFAULT;
      break;
    case MIMEKIND_FILE:
      contenttype = Curl_mime_contenttype(part->filename);
      if(!contenttype)
        contenttype = Curl_mime_contenttype(part->data);
      if(!contenttype && part->filename)
        contenttype = FILE_CONTENTTYPE_DEFAULT;
      break;
    default:
      contenttype = Curl_mime_contenttype(part->filename);
      break;
    }
  }

  if(part->kind == MIMEKIND_MULTIPART) {
    mime = (curl_mime *) part->arg;
    if(mime)
      boundary = mime->boundary;
  }
  else if(contenttype && !customct &&
          content_type_match(contenttype, STRCONST("text/plain")))
    if(strategy == MIMESTRATEGY_MAIL || !part->filename)
      contenttype = NULL;

  /* Issue content-disposition header only if not already set by caller. */
  if(!search_header(part->userheaders, STRCONST("Content-Disposition"))) {
    if(!disposition)
      if(part->filename || part->name ||
        (contenttype && !strncasecompare(contenttype, "multipart/", 10)))
          disposition = DISPOSITION_DEFAULT;
    if(disposition && curl_strequal(disposition, "attachment") &&
     !part->name && !part->filename)
      disposition = NULL;
    if(disposition) {
      char *name = NULL;
      char *filename = NULL;

      if(part->name) {
        name = escape_string(data, part->name, strategy);
        if(!name)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret && part->filename) {
        filename = escape_string(data, part->filename, strategy);
        if(!filename)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret)
        ret = Curl_mime_add_header(&part->curlheaders,
                                   "Content-Disposition: %s%s%s%s%s%s%s",
                                   disposition,
                                   name? "; name=\"": "",
                                   name? name: "",
                                   name? "\"": "",
                                   filename? "; filename=\"": "",
                                   filename? filename: "",
                                   filename? "\"": "");
      Curl_safefree(name);
      Curl_safefree(filename);
      if(ret)
        return ret;
      }
    }

  /* Issue Content-Type header. */
  if(contenttype) {
    ret = add_content_type(&part->curlheaders, contenttype, boundary);
    if(ret)
      return ret;
  }

  /* Content-Transfer-Encoding header. */
  if(!search_header(part->userheaders,
                    STRCONST("Content-Transfer-Encoding"))) {
    if(part->encoder)
      cte = part->encoder->name;
    else if(contenttype && strategy == MIMESTRATEGY_MAIL &&
     part->kind != MIMEKIND_MULTIPART)
      cte = "8bit";
    if(cte) {
      ret = Curl_mime_add_header(&part->curlheaders,
                                 "Content-Transfer-Encoding: %s", cte);
      if(ret)
        return ret;
    }
  }

  /* If we were reading curl-generated headers, restart with new ones (this
     should not occur). */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, part->curlheaders);

  /* Process subparts. */
  if(part->kind == MIMEKIND_MULTIPART && mime) {
    curl_mimepart *subpart;

    disposition = NULL;
    if(content_type_match(contenttype, STRCONST("multipart/form-data")))
      disposition = "form-data";
    for(subpart = mime->firstpart; subpart; subpart = subpart->nextpart) {
      ret = Curl_mime_prepare_headers(data, subpart, NULL,
                                      disposition, strategy);
      if(ret)
        return ret;
    }
  }
  return ret;
}